

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.hh
# Opt level: O1

int4 ActionInferTypes::propagateAddPointer(PcodeOp *op,int4 slot)

{
  OpCode OVar1;
  uint uVar2;
  long lVar3;
  Varnode *pVVar4;
  bool bVar5;
  
  OVar1 = op->opcode->opcode;
  lVar3 = 0x10;
  if ((OVar1 == CPUI_PTRADD && slot == 0) || (lVar3 = 8, OVar1 == CPUI_PTRSUB && slot == 0)) {
    pVVar4 = *(Varnode **)
              ((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar3);
  }
  else {
    if (OVar1 != CPUI_INT_ADD) {
      return -1;
    }
    pVVar4 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[1 - slot];
    uVar2 = pVVar4->flags;
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 0x10) == 0) {
        return -1;
      }
      if (pVVar4->def->opcode->opcode != CPUI_INT_MULT) {
        return -1;
      }
    }
    bVar5 = ((pVVar4->temp).dataType)->metatype == TYPE_PTR;
    if ((uVar2 & 2) == 0 || bVar5) {
      return -(uint)bVar5;
    }
  }
  return (int4)(pVVar4->loc).offset;
}

Assistant:

TypeOp *getOpcode(void) const { return opcode; }